

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranLexer.cxx
# Opt level: O0

int cmFortran_yylex_init(yyscan_t *ptr_yy_globals)

{
  int *piVar1;
  void *pvVar2;
  yyscan_t *ptr_yy_globals_local;
  
  if (ptr_yy_globals == (yyscan_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    ptr_yy_globals_local._4_4_ = 1;
  }
  else {
    pvVar2 = cmFortran_yyalloc(0x90,(yyscan_t)0x0);
    *ptr_yy_globals = pvVar2;
    if (*ptr_yy_globals == (yyscan_t)0x0) {
      piVar1 = __errno_location();
      *piVar1 = 0xc;
      ptr_yy_globals_local._4_4_ = 1;
    }
    else {
      memset(*ptr_yy_globals,0,0x90);
      ptr_yy_globals_local._4_4_ = yy_init_globals(*ptr_yy_globals);
    }
  }
  return ptr_yy_globals_local._4_4_;
}

Assistant:

int yylex_init(yyscan_t* ptr_yy_globals)
{
    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }

    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), NULL );

    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }

    /* By setting to 0xAA, we expose bugs in yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));

    return yy_init_globals ( *ptr_yy_globals );
}